

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void kj::anon_unknown_8::setCloexec(int fd)

{
  int iVar1;
  void *pvVar2;
  Fault local_78;
  Fault f_2;
  SyscallResult local_5c;
  SyscallResult _kjSyscallResult_1;
  Fault f_1;
  SyscallResult local_3c;
  undefined1 local_38 [4];
  SyscallResult _kjSyscallResult;
  int flags;
  Fault local_28;
  Fault f;
  anon_class_8_1_3fcf657c aStack_18;
  int error;
  int local_10;
  undefined1 local_c [4];
  int _kjSyscallError;
  int fd_local;
  
  aStack_18.fd = (int *)local_c;
  local_c = (undefined1  [4])fd;
  f.exception._4_4_ =
       kj::_::Debug::syscallError<kj::(anonymous_namespace)::setCloexec(int)::__0>
                 (&stack0xffffffffffffffe8,false);
  if (f.exception._4_4_ != 0) {
    local_10 = f.exception._4_4_;
    if ((f.exception._4_4_ != 0x16) && (f.exception._4_4_ != 0x5f)) {
      kj::_::Debug::Fault::Fault
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x5e,f.exception._4_4_,"ioctl(fd, FIOCLEX)","");
      kj::_::Debug::Fault::~Fault(&local_28);
    }
    f_1.exception = (Exception *)local_38;
    local_3c = kj::_::Debug::syscall<kj::(anonymous_namespace)::setCloexec(int)::__1>
                         ((anon_class_16_2_9524df8e *)&f_1,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_3c);
    if (pvVar2 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_3c);
      kj::_::Debug::Fault::Fault
                ((Fault *)&stack0xffffffffffffffa8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x6c,iVar1,"flags = fcntl(fd, F_GETFD)","");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffa8);
    }
    if (((uint)local_38 & 1) == 0) {
      f_2.exception = (Exception *)local_c;
      local_5c = kj::_::Debug::syscall<kj::(anonymous_namespace)::setCloexec(int)::__2>
                           ((anon_class_16_2_09390194 *)&f_2,false);
      pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_5c);
      if (pvVar2 == (void *)0x0) {
        iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_5c);
        kj::_::Debug::Fault::Fault
                  (&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6e,iVar1,"fcntl(fd, F_SETFD, flags | FD_CLOEXEC)","");
        kj::_::Debug::Fault::fatal(&local_78);
      }
    }
  }
  return;
}

Assistant:

static void setCloexec(int fd) {
  // Set the O_CLOEXEC flag on the given fd.
  //
  // We try to avoid the need to call this by taking advantage of syscall flags that set it
  // atomically on new file descriptors. Unfortunately some platforms do not support such syscalls.

#ifdef FIOCLEX
  // Yay, we can set the flag in one call.
  KJ_SYSCALL_HANDLE_ERRORS(ioctl(fd, FIOCLEX)) {
    case EINVAL:
    case EOPNOTSUPP:
      break;
    default:
      KJ_FAIL_SYSCALL("ioctl(fd, FIOCLEX)", error) { break; }
      break;
  } else {
    // success
    return;
  }
#endif

  // Sadness, we must resort to read/modify/write.
  //
  // (On many platforms, FD_CLOEXEC is the only flag modifiable via F_SETFD and therefore we could
  // skip the read... but it seems dangerous to assume that's true of all platforms, and anyway
  // most platforms support FIOCLEX.)
  int flags;
  KJ_SYSCALL(flags = fcntl(fd, F_GETFD));
  if (!(flags & FD_CLOEXEC)) {
    KJ_SYSCALL(fcntl(fd, F_SETFD, flags | FD_CLOEXEC));
  }
}